

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

QNetworkReply * __thiscall
QNetworkAccessManager::put(QNetworkAccessManager *this,QNetworkRequest *request,QByteArray *data)

{
  long lVar1;
  QBuffer *this_00;
  QNetworkReply *pQVar2;
  QNetworkRequest *in_RDI;
  long in_FS_OFFSET;
  QNetworkReply *reply;
  QBuffer *buffer;
  QBuffer *data_00;
  QNetworkAccessManager *in_stack_ffffffffffffffc0;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QBuffer *)operator_new(0x10);
  QBuffer::QBuffer(this_00,(QObject *)0x0);
  QBuffer::setData((QByteArray *)this_00);
  data_00 = this_00;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,(OpenModeFlag)((ulong)this_00 >> 0x20));
  (**(code **)(*(long *)data_00 + 0x68))(data_00,local_c);
  pQVar2 = put(in_stack_ffffffffffffffc0,in_RDI,(QIODevice *)data_00);
  QObject::setParent((QObject *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *QNetworkAccessManager::put(const QNetworkRequest &request, const QByteArray &data)
{
    QBuffer *buffer = new QBuffer;
    buffer->setData(data);
    buffer->open(QIODevice::ReadOnly);

    QNetworkReply *reply = put(request, buffer);
    buffer->setParent(reply);
    return reply;
}